

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
TestDiagnosticInternal::TestDiagnosticInternal
          (TestDiagnosticInternal *this,TestRegistry *r,string *name)

{
  string local_40 [32];
  string *local_20;
  string *name_local;
  TestRegistry *r_local;
  TestDiagnosticInternal *this_local;
  
  local_20 = name;
  name_local = (string *)r;
  r_local = (TestRegistry *)this;
  std::__cxx11::string::string(local_40);
  testinator::Test::Test(&this->super_Test,r,name,(string *)local_40);
  std::__cxx11::string::~string(local_40);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__TestDiagnosticInternal_002c2c60;
  return;
}

Assistant:

TestDiagnosticInternal(testinator::TestRegistry& r, const string& name)
    : testinator::Test(r, name)
  {}